

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modhelp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Option *pOVar1;
  ostream *poVar2;
  CallForHelp *this;
  allocator local_2f2;
  allocator local_2f1;
  string some_option;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  App test;
  
  std::__cxx11::string::string((string *)&local_210,"",(allocator *)&some_option);
  CLI::App::App(&test,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"",(allocator *)&some_option);
  std::__cxx11::string::string((string *)&local_250,"",&local_2f2);
  CLI::App::set_help_flag(&test,&local_230,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_270,"-h,--help",(allocator *)&some_option);
  std::__cxx11::string::string((string *)&local_290,"Request help",&local_2f2);
  pOVar1 = CLI::App::add_flag(&test,&local_270,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  some_option._M_dataplus._M_p = (pointer)&some_option.field_2;
  some_option._M_string_length = 0;
  some_option.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_2b0,"-a",&local_2f2);
  std::__cxx11::string::string((string *)&local_2d0,"Some description",&local_2f1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&test,&local_2b0,&some_option,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  CLI::App::parse(&test,argc,argv);
  if ((pOVar1->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pOVar1->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Option string:");
    poVar2 = std::operator<<(poVar2,(string *)&some_option);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&some_option);
    CLI::App::~App(&test);
    return 0;
  }
  this = (CallForHelp *)__cxa_allocate_exception(0x38);
  CLI::CallForHelp::CallForHelp(this);
  __cxa_throw(this,&CLI::CallForHelp::typeinfo,CLI::Error::~Error);
}

Assistant:

int main(int argc, char **argv) {
    CLI::App test;

    // Remove help flag because it shortcuts all processing
    test.set_help_flag();

    // Add custom flag that activates help
    auto help = test.add_flag("-h,--help", "Request help");

    std::string some_option;
    test.add_option("-a", some_option, "Some description");

    try {
        test.parse(argc, argv);
        if(*help)
            throw CLI::CallForHelp();
    } catch(const CLI::Error &e) {
        std::cout << "Option string:" << some_option << std::endl;
        return test.exit(e);
    }

    std::cout << "Option string:" << some_option << std::endl;
    return 0;
}